

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O2

void __thiscall
llvm::yaml::NullNode::NullNode
          (NullNode *this,
          unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *D)

{
  Node::Node(&this->super_Node,0,D,(StringRef)ZEXT816(0),(StringRef)ZEXT816(0));
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_anchor_011294e0;
  return;
}

Assistant:

NullNode(std::unique_ptr<Document> &D)
      : Node(NK_Null, D, StringRef(), StringRef()) {}